

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word_split.cpp
# Opt level: O0

void __thiscall
WordSplitSVTest_two_words_Test<signed_char>::WordSplitSVTest_two_words_Test
          (WordSplitSVTest_two_words_Test<signed_char> *this)

{
  WordSplitSVTest_two_words_Test<signed_char> *this_local;
  
  WordSplitSVTest<signed_char>::WordSplitSVTest(&this->super_WordSplitSVTest<signed_char>);
  *(undefined ***)&this->super_WordSplitSVTest<signed_char> =
       &PTR__WordSplitSVTest_two_words_Test_00823c88;
  return;
}

Assistant:

TYPED_TEST(WordSplitSVTest, two_words) {
	auto word = make_word<TypeParam>();
	word += default_delim<TypeParam>;
	word += make_word<TypeParam>();
	std::basic_string_view<TypeParam> words = word;
	std::vector<std::basic_string<TypeParam>> split_result = word_split(words, default_delim<TypeParam>);
	EXPECT_EQ(split_result.size(), 2);
	EXPECT_EQ(split_result[0].size(), 8);
	EXPECT_EQ(split_result[1].size(), 8);
}